

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O2

size_t __thiscall
ProductAggregate_hash::operator()(ProductAggregate_hash *this,ProductAggregate *key)

{
  size_t sVar1;
  ulong uVar2;
  hash<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_1a;
  hash<std::bitset<1500UL>_> local_19;
  
  sVar1 = std::hash<std::bitset<1500UL>_>::operator()(&local_19,&key->product);
  uVar2 = sVar1 + 0x9e3779b9;
  uVar2 = uVar2 ^ (uVar2 >> 2) + 0x9e3779b9 + uVar2 * 0x40 + (key->previous).first;
  uVar2 = uVar2 ^ (uVar2 >> 2) + 0x9e3779b9 + uVar2 * 0x40 + (key->previous).second;
  sVar1 = std::
          hash<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::operator()(&local_1a,&key->viewAggregate);
  uVar2 = sVar1 + uVar2 * 0x40 + (uVar2 >> 2) + 0x9e3779b9 ^ uVar2;
  return uVar2 ^ (uVar2 >> 2) + 0x9e3779b9 + (uVar2 << 6 | (ulong)key->multiplyByCount);
}

Assistant:

size_t operator()(const ProductAggregate &key ) const
    {
        size_t h = 0;
        h ^= std::hash<prod_bitset>()(key.product)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.previous.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.previous.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<std::vector<std::pair<size_t,size_t>>>()(key.viewAggregate)+
            0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<bool>()(key.multiplyByCount)+0x9e3779b9 + (h<<6) + (h>>2);
        return h;
    }